

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O3

void nga_sprs_array_col_block_list_(Integer *s_a,Integer *idx,Integer *n)

{
  long lVar1;
  Integer *blocks;
  Integer nn;
  Integer *local_28;
  long local_20;
  
  pnga_sprs_array_col_block_list(*s_a,&local_28,&local_20);
  if (*n < local_20) {
    pnga_error("nga_sprs_array_col_block_list: allocated array is too small for number of blocks found: "
               ,local_20);
  }
  else {
    if (0 < local_20) {
      lVar1 = 0;
      do {
        idx[lVar1] = local_28[lVar1];
        lVar1 = lVar1 + 1;
      } while (local_20 != lVar1);
    }
    free(local_28);
    *n = local_20;
  }
  return;
}

Assistant:

void nga_sprs_array_col_block_list_(Integer *s_a, Integer *idx, Integer *n)
{
  /* This function assumes that idx has already been allocated by calling
   * program and that nn is the length of idx on input. On output, nn is
   * changed to the actual number of blocks found by the
   * wnga_sprs_array_col_block_list function
   */
  Integer nn;
  Integer *blocks;
  wnga_sprs_array_col_block_list(*s_a, &blocks, &nn);
  if (*n < nn) {
    wnga_error("nga_sprs_array_col_block_list: allocated array is too small for"
        " number of blocks found: ",nn);
  } else {
    int i;
    for (i=0; i<nn; i++) idx[i] = blocks[i];
    free(blocks);
    *n = nn;
  }
}